

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O2

void __thiscall ValidateFootprint::CheckOrder(ValidateFootprint *this)

{
  int iVar1;
  uint uVar2;
  char idName [10];
  undefined8 local_18;
  undefined2 local_10;
  
  iVar1 = (this->fr_).event_id;
  if (iVar1 < this->prevEventID_) {
    local_18 = CONCAT26(local_18._6_2_,0x7400000000);
    local_18 = CONCAT44(local_18._4_4_,0x6e657645);
  }
  else {
    if (iVar1 != this->prevEventID_) {
      return;
    }
    if (this->prevAreaPerilID_ <= (this->fr_).super_EventRow.areaperil_id) {
      return;
    }
    local_18 = 0x6972657061657241;
    local_10 = 0x6c;
  }
  uVar2 = (this->super_Validate).lineno_;
  fprintf(_stderr,"%s IDs in lines %d and %d are not in ascending order:\n%s\n%s\n",&local_18,
          (ulong)(uVar2 - 1),(ulong)uVar2,this->prevLine_,&this->super_Validate);
  Validate::PrintErrorMessage(&this->super_Validate);
  return;
}

Assistant:

inline void ValidateFootprint::CheckOrder() {
/* Check event IDs and areaperil IDs are in ascending order. */

  char idName[10];

  if (fr_.event_id < prevEventID_) {

    strcpy(idName, "Event");

  } else if ((fr_.areaperil_id < prevAreaPerilID_) &&
	     (fr_.event_id == prevEventID_)) {

    strcpy(idName, "Areaperil");

  } else return;

  fprintf(stderr, "%s IDs in lines %d and %d are not in ascending"
		  " order:\n%s\n%s\n",
	  idName, lineno_ - 1, lineno_, prevLine_, line_);
  PrintErrorMessage();

}